

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O2

uint32_t cpu_ldub_mmuidx_ra_mips
                   (CPUArchState_conflict5 *env,abi_ptr_conflict addr,int mmu_idx,uintptr_t ra)

{
  uint64_t uVar1;
  
  uVar1 = load_helper(env,addr,mmu_idx,ra,MO_8,false,full_ldub_mmu);
  return (uint32_t)uVar1;
}

Assistant:

static inline uint64_t cpu_load_helper(CPUArchState *env, abi_ptr addr,
                                       int mmu_idx, uintptr_t retaddr,
                                       MemOp op, FullLoadHelper *full_load) // qq
{
    TCGMemOpIdx oi;
    uint64_t ret;

    op &= ~MO_SIGN;
    oi = make_memop_idx(op, mmu_idx);
    ret = full_load(env, addr, oi, retaddr);

    return ret;
}